

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3Rehash(Fts3Hash *pH,int new_size)

{
  Fts3HashElem *pFVar1;
  uint uVar2;
  _fts3ht *p_Var3;
  _func_int_void_ptr_int *p_Var4;
  int h;
  _func_int_void_ptr_int *xHash;
  Fts3HashElem *next_elem;
  Fts3HashElem *elem;
  _fts3ht *new_ht;
  int new_size_local;
  Fts3Hash *pH_local;
  
  p_Var3 = (_fts3ht *)fts3HashMalloc((long)new_size << 4);
  if (p_Var3 == (_fts3ht *)0x0) {
    pH_local._4_4_ = 1;
  }
  else {
    fts3HashFree(pH->ht);
    pH->ht = p_Var3;
    pH->htsize = new_size;
    p_Var4 = ftsHashFunction((int)pH->keyClass);
    next_elem = pH->first;
    pH->first = (Fts3HashElem *)0x0;
    while (next_elem != (Fts3HashElem *)0x0) {
      uVar2 = (*p_Var4)(next_elem->pKey,next_elem->nKey);
      pFVar1 = next_elem->next;
      fts3HashInsertElement(pH,p_Var3 + (int)(uVar2 & new_size - 1U),next_elem);
      next_elem = pFVar1;
    }
    pH_local._4_4_ = 0;
  }
  return pH_local._4_4_;
}

Assistant:

static int fts3Rehash(Fts3Hash *pH, int new_size){
  struct _fts3ht *new_ht;          /* The new hash table */
  Fts3HashElem *elem, *next_elem;  /* For looping over existing elements */
  int (*xHash)(const void*,int);   /* The hash function */

  assert( (new_size & (new_size-1))==0 );
  new_ht = (struct _fts3ht *)fts3HashMalloc( new_size*sizeof(struct _fts3ht) );
  if( new_ht==0 ) return 1;
  fts3HashFree(pH->ht);
  pH->ht = new_ht;
  pH->htsize = new_size;
  xHash = ftsHashFunction(pH->keyClass);
  for(elem=pH->first, pH->first=0; elem; elem = next_elem){
    int h = (*xHash)(elem->pKey, elem->nKey) & (new_size-1);
    next_elem = elem->next;
    fts3HashInsertElement(pH, &new_ht[h], elem);
  }
  return 0;
}